

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

BTLeafNode * __thiscall
storage::BTLeafNode::insert_(BTLeafNode *this,int key,Record *record,bool *out)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  BTLeafNode *pBVar4;
  ulong uVar5;
  uint uVar6;
  int local_2c;
  Record *local_28;
  
  *out = true;
  bVar3 = search_record(this,key,&local_28,&local_2c);
  if (bVar3) {
    *out = false;
  }
  else {
    iVar2 = (this->super_BTNode).used_links_count_;
    if (0x32 < iVar2) {
      pBVar4 = split(this,key,record);
      return pBVar4;
    }
    uVar5 = (ulong)(iVar2 - 1);
    for (uVar6 = iVar2 - 2;
        (-1 < (int)uVar6 && (iVar2 = (this->super_BTNode).keys_[uVar6], key < iVar2));
        uVar6 = uVar6 - 1) {
      (this->super_BTNode).keys_[uVar5] = iVar2;
      this->record_links_[uVar5] = this->record_links_[uVar6];
      uVar5 = uVar5 - 1;
    }
    (this->super_BTNode).keys_[(int)uVar5] = key;
    this->record_links_[(int)uVar5] = record;
    piVar1 = &(this->super_BTNode).used_links_count_;
    *piVar1 = *piVar1 + 1;
  }
  return (BTLeafNode *)0x0;
}

Assistant:

BTLeafNode *BTLeafNode::insert_(int key, Record *record, bool &out) {
        out = true;
        Record *a = nullptr;
        int index = -1;
        if (!search_record(key, a, index)) {
            if (!full()) {
                int i = 0;
                for (i = used_links_count_ - 2; i >= 0; --i) {
                    if (keys_[i] > key) {
                        keys_[i + 1] = keys_[i];
                        record_links_[i + 1] = record_links_[i];
                    } else {
                        break;
                    }
                }
                keys_[i + 1] = key;
                record_links_[i + 1] = record;
                used_links_count_++;
            } else {
                return split(key, record);
            }
        } else {
            out = false;
        }
        return nullptr;
    }